

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

App * __thiscall CLI::App::get_subcommand(App *this,int index)

{
  pointer psVar1;
  OptionNotFound *this_00;
  uint uindex;
  string sStack_38;
  
  if ((-1 < index) &&
     (psVar1 = (this->subcommands_).
               super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (ulong)(uint)index <
     (ulong)((long)(this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4))) {
    return psVar1[(uint)index].super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  std::__cxx11::to_string(&sStack_38,index);
  OptionNotFound::OptionNotFound(this_00,&sStack_38);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

CLI11_NODISCARD CLI11_INLINE App *App::get_subcommand(int index) const {
    if(index >= 0) {
        auto uindex = static_cast<unsigned>(index);
        if(uindex < subcommands_.size())
            return subcommands_[uindex].get();
    }
    throw OptionNotFound(std::to_string(index));
}